

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolIndexSearch.h
# Opt level: O3

string * __thiscall
SymbolIndexSearch::operator()[abi_cxx11_
          (string *__return_storage_ptr__,SymbolIndexSearch *this,Token *token)

{
  char *pcVar1;
  pointer pbVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  Page *pPVar6;
  size_t __n;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  byte bVar10;
  string_view *v;
  pointer pbVar11;
  SearchBase *this_00;
  string *htmlPage;
  string_view delimiter;
  string_view subtoken;
  string_view subtoken_00;
  string_view subtoken_01;
  string_view str;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  subtokens;
  string local_100;
  string local_e0;
  SearchBase *local_c0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b8;
  string *local_a0;
  ulong local_98;
  long local_90;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_88;
  byte local_78;
  string local_70;
  string local_50;
  
  if (token->type == std) {
    delimiter._M_str = "::";
    delimiter._M_len = 2;
    str._M_str = (token->content)._M_dataplus._M_p;
    str._M_len = (token->content)._M_string_length;
    local_c0 = &this->super_SearchBase;
    ::str::split(&local_b8,str,delimiter);
    pbVar2 = local_b8.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = local_b8.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
        pbVar11 = pbVar11 + 1) {
      __n = pbVar11->_M_len;
      if (__n != 0) {
        pcVar1 = pbVar11->_M_str;
        pvVar3 = memchr(pcVar1,0x3c,__n);
        sVar4 = (long)pvVar3 - (long)pcVar1;
        if ((sVar4 == 0xffffffffffffffff || pvVar3 == (void *)0x0) ||
           (pbVar11->_M_len = sVar4, __n = sVar4, sVar4 != 0)) {
          pcVar1 = pbVar11->_M_str;
          pvVar3 = memchr(pcVar1,0x28,__n);
          sVar5 = (long)pvVar3 - (long)pcVar1;
          if (sVar5 != 0xffffffffffffffff && pvVar3 != (void *)0x0) {
            pbVar11->_M_len = sVar5;
          }
        }
      }
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/w/cpp/symbol_index","");
    local_a0 = __return_storage_ptr__;
    pPVar6 = SearchBase::getPage(local_c0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (ulong)((long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_98 = 1;
      lVar8 = 0x18;
      this_00 = local_c0;
      do {
        sVar5 = *(size_t *)
                 ((long)local_b8.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
        pcVar1 = *(char **)((long)&(local_b8.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_90 = lVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"<span>","");
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"</span>","");
        htmlPage = &pPVar6->content;
        subtoken._M_str = pcVar1;
        subtoken._M_len = sVar5;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_88._M_value,this_00,htmlPage,subtoken,&local_100,&local_e0);
        bVar10 = local_78;
        uVar7 = local_88._M_value._M_str;
        uVar9 = local_88._M_value._M_len;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((bVar10 & 1) == 0) {
          sVar5 = *(size_t *)
                   ((long)local_b8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_90 + -8);
          pcVar1 = *(char **)((long)&(local_b8.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_len + local_90)
          ;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"<code>","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"</code>","");
          subtoken_00._M_str = pcVar1;
          subtoken_00._M_len = sVar5;
          SearchBase::findLinkToSubtoken
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_88._M_value,local_c0,htmlPage,subtoken_00,&local_100,&local_e0);
          bVar10 = local_78;
          uVar7 = local_88._M_value._M_str;
          uVar9 = local_88._M_value._M_len;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        if ((bVar10 & 1) == 0) {
          sVar5 = *(size_t *)
                   ((long)local_b8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_90 + -8);
          pcVar1 = *(char **)((long)&(local_b8.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_len + local_90)
          ;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"<tt>","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"</tt>","");
          subtoken_01._M_str = pcVar1;
          subtoken_01._M_len = sVar5;
          SearchBase::findLinkToSubtoken
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_88._M_value,local_c0,htmlPage,subtoken_01,&local_100,&local_e0);
          bVar10 = local_78;
          uVar7 = local_88._M_value._M_str;
          uVar9 = local_88._M_value._M_len;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        __return_storage_ptr__ = local_a0;
        if ((bVar10 & 1) == 0) {
          (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
          goto LAB_00151293;
        }
        if (local_98 ==
            ((long)local_b8.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
          (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,uVar7,(char *)(uVar7 + uVar9));
          goto LAB_00151293;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,uVar7,(char *)(uVar7 + uVar9));
        this_00 = local_c0;
        pPVar6 = SearchBase::getPage(local_c0,&local_70);
        lVar8 = local_90;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        local_98 = local_98 + 1;
        lVar8 = lVar8 + 0x10;
      } while (local_98 <
               (ulong)((long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    __return_storage_ptr__ = local_a0;
    (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
LAB_00151293:
    if (local_b8.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
		if (token.type != Token::Type::std) {
			return "";
		}

		std::vector<std::string_view> subtokens = str::split(token.content, "::");
		for (std::string_view& v : subtokens) {
			const size_t start_template = v.find('<');
			if (start_template != std::string_view::npos) {
				v.remove_suffix(v.size() - start_template);
			}

			const size_t start_parenthesis = v.find('(');
			if (start_parenthesis != std::string_view::npos) {
				v.remove_suffix(v.size() - start_parenthesis);
			}
		}

		Page* page = getPage("/w/cpp/symbol_index");
		for (size_t i = 1; i < subtokens.size(); i++) {
			std::optional<std::string_view> link;

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<span>", "</span>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<code>", "</code>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<tt>", "</tt>");
			}

			if (!link.has_value()) {
				return "";
			}


			if (i == subtokens.size() - 1) {
				return std::string(link.value());
			}

			page = getPage(std::string(link.value()));
		}

		return "";
	}